

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cpu.cpp
# Opt level: O0

void __thiscall
geemuboi::test::core::CpuTest_ld_a_mde_Test::~CpuTest_ld_a_mde_Test(CpuTest_ld_a_mde_Test *this)

{
  CpuTest_ld_a_mde_Test *this_local;
  
  ~CpuTest_ld_a_mde_Test(this);
  operator_delete(this,0x150);
  return;
}

Assistant:

TEST_F(CpuTest, ld_a_mde) {
    regs.f = ICpu::Z_FLAG | ICpu::N_FLAG | ICpu::H_FLAG | ICpu::C_FLAG;
    regs.d = 0xFF;
    regs.e = 0xEE;

    EXPECT_CALL(mmu, read_byte(0xFFEE)).WillOnce(Return(0xDD));
    execute_instruction(0x1A);

    ICpu::Registers expected_regs{};
    expected_regs.a = 0xDD;
    expected_regs.d = 0xFF;
    expected_regs.e = 0xEE;
    expected_regs.f = ICpu::Z_FLAG | ICpu::N_FLAG | ICpu::H_FLAG | ICpu::C_FLAG;
    expected_regs.pc = 1;
    verify_state_changes(expected_regs);

    EXPECT_EQ(cpu->get_cycles_executed(), 2);
}